

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<VkSurfaceFormatKHR> *
vkb::detail::find_desired_surface_format
          (Result<VkSurfaceFormatKHR> *__return_storage_ptr__,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *available_formats,
          vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *desired_formats)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  pointer pVVar5;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *__range2;
  pointer pVVar6;
  
  pVVar5 = (desired_formats->
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (desired_formats->
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar5 != pVVar1) {
    pVVar2 = (available_formats->
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (available_formats->
             super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pVVar2 != pVVar3) {
        pVVar6 = pVVar2;
        do {
          if ((pVVar5->format == pVVar6->format) && (pVVar5->colorSpace == pVVar6->colorSpace)) {
            (__return_storage_ptr__->field_0).m_value = *pVVar5;
            bVar4 = true;
            goto LAB_00122eb0;
          }
          pVVar6 = pVVar6 + 1;
        } while (pVVar6 != pVVar3);
      }
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != pVVar1);
  }
  (__return_storage_ptr__->field_0).m_value.format = VK_FORMAT_R5G6B5_UNORM_PACK16;
  *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &surface_support_error_category;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  bVar4 = false;
LAB_00122eb0:
  __return_storage_ptr__->m_init = bVar4;
  return __return_storage_ptr__;
}

Assistant:

Result<VkSurfaceFormatKHR> find_desired_surface_format(
    std::vector<VkSurfaceFormatKHR> const& available_formats, std::vector<VkSurfaceFormatKHR> const& desired_formats) {
    for (auto const& desired_format : desired_formats) {
        for (auto const& available_format : available_formats) {
            // finds the first format that is desired and available
            if (desired_format.format == available_format.format && desired_format.colorSpace == available_format.colorSpace) {
                return desired_format;
            }
        }
    }

    // if no desired format is available, we report that no format is suitable to the user request
    return { make_error_code(SurfaceSupportError::no_suitable_desired_format) };
}